

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  Descriptor *this_00;
  long lVar1;
  size_t sVar2;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  string_view undefined_symbol;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_03;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_04;
  ErrorLocation EVar3;
  code *pcVar4;
  bool bVar5;
  OneofDescriptor *pOVar6;
  undefined8 *puVar7;
  once_flag *poVar8;
  FieldDescriptor *pFVar9;
  ExtensionRange *pEVar10;
  ReservedRange *pRVar11;
  reference ppVar12;
  size_t *psVar13;
  EnumDescriptor *pEVar14;
  Symbol SVar15;
  EnumDescriptor *pEVar16;
  EnumValueDescriptor *pEVar17;
  FieldOptions *pFVar18;
  AlphaNum *b;
  char *pcVar19;
  byte bVar20;
  int i;
  int iVar21;
  ulong uVar22;
  PlaceholderType placeholder_type;
  char *pcVar23;
  byte bVar24;
  long x;
  undefined8 *puVar25;
  undefined4 uVar26;
  iterator iVar27;
  string_view element_name;
  string_view element_name_00;
  string_view element_name_01;
  string_view name;
  string_view name_00;
  string_view element_name_02;
  string_view name_01;
  string_view element_name_03;
  string_view element_name_04;
  string_view element_name_05;
  string_view name_02;
  string_view element_name_06;
  string_view relative_to;
  string_view relative_to_00;
  string_view relative_to_01;
  ulong uStackY_1e0;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  FieldDescriptor *field_local;
  allocator<char> local_1b9;
  anon_class_16_2_f7c7e1e7 make_error;
  Symbol extendee;
  FieldDescriptor *conflicting_field;
  btree_set<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>_>
  fields_used;
  FieldDescriptor *local_130 [2];
  undefined1 local_120 [16];
  FileDescriptor *local_110;
  code *pcStack_108;
  pointer local_100;
  code *pcStack_f8;
  undefined1 local_f0 [16];
  undefined1 local_e0 [16];
  undefined1 local_d0 [16];
  anon_class_16_2_f7c7e1e7 *local_c0;
  code *pcStack_b8;
  undefined1 local_b0 [16];
  FileDescriptor *local_a0;
  _Alloc_hider _Stack_98;
  undefined1 local_90 [24];
  code *pcStack_78;
  undefined1 local_70 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_68;
  _Alloc_hider _Stack_58;
  string proposed_message;
  
  field_local = field;
  if (((undefined1  [80])((undefined1  [80])proto->field_0 & (undefined1  [80])0x2) !=
       (undefined1  [80])0x0) && ((field->field_0x1 & 8) != 0)) {
    puVar7 = (undefined8 *)
             ((ulong)(proto->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar19 = (field->all_names_).payload_;
    relative_to._M_len = (ulong)*(ushort *)(pcVar19 + 2);
    relative_to._M_str = pcVar19 + ~relative_to._M_len;
    name._M_str = (char *)*puVar7;
    name._M_len = puVar7[1];
    extendee = LookupSymbol(this,name,relative_to,PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL,true);
    if ((extendee.ptr_)->symbol_type_ == '\x01') {
      bVar5 = Symbol::IsVisibleFrom(&extendee,this->file_);
      if (bVar5) {
        SVar15.ptr_ = &((Descriptor *)0x0)->super_SymbolBase;
        if ((extendee.ptr_)->symbol_type_ == '\x01') {
          SVar15.ptr_ = extendee.ptr_;
        }
        field_local->containing_type_ = (Descriptor *)SVar15.ptr_;
        pEVar10 = Descriptor::FindExtensionRangeContainingNumber
                            ((Descriptor *)SVar15.ptr_,field_local->number_);
        if (pEVar10 == (ExtensionRange *)0x0) {
          pcVar19 = (field_local->all_names_).payload_;
          element_name_02._M_len = (ulong)*(ushort *)(pcVar19 + 2);
          element_name_02._M_str = pcVar19 + ~element_name_02._M_len;
          local_90._0_8_ = &make_error;
          make_error.this = (DescriptorBuilder *)&field_local;
          local_90._8_8_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__2,std::__cxx11::string>
          ;
          make_error_01.invoker_._0_4_ = 0xc0b9bf;
          make_error_01.ptr_.obj = (void *)local_90._0_8_;
          make_error_01.invoker_._4_4_ = 0;
          AddError(this,element_name_02,&proto->super_Message,NUMBER,make_error_01);
        }
        goto LAB_00bfe4ae;
      }
      pcVar19 = (field_local->all_names_).payload_;
      uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
      pcVar19 = pcVar19 + ~uVar22;
      local_90._16_8_ = &make_error;
      make_error.field = (FieldDescriptor **)this;
      make_error.this = (DescriptorBuilder *)&extendee;
      pcStack_78 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__1,std::__cxx11::string>
      ;
      pcVar4 = pcStack_78;
      pcStack_78._0_4_ = 0xc0b996;
      uVar26 = pcStack_78._0_4_;
      pcStack_78 = pcVar4;
    }
    else {
      if ((extendee.ptr_)->symbol_type_ == '\0') {
        pcVar19 = (field->all_names_).payload_;
        uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
        pcVar19 = pcVar19 + ~uVar22;
        puVar7 = (undefined8 *)
                 ((ulong)(proto->field_0)._impl_.extendee_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
        _Stack_58._M_p = (pointer)*puVar7;
        aStack_68._8_8_ = puVar7[1];
        uVar26 = (undefined4)aStack_68._8_8_;
        uVar28 = (undefined4)((ulong)aStack_68._8_8_ >> 0x20);
        uVar29 = SUB84(_Stack_58._M_p,0);
        uVar30 = (undefined4)((ulong)_Stack_58._M_p >> 0x20);
        EVar3 = EXTENDEE;
        goto LAB_00bfec13;
      }
      pcVar19 = (field->all_names_).payload_;
      uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
      pcVar19 = pcVar19 + ~uVar22;
      local_70 = (undefined1  [8])&make_error;
      make_error.this = (DescriptorBuilder *)proto;
      aStack_68._M_allocated_capacity =
           (size_type)
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__0,std::__cxx11::string>
      ;
      pcVar4 = (code *)aStack_68._M_allocated_capacity;
      aStack_68._M_allocated_capacity._0_4_ = 0xc0b91a;
      uVar26 = aStack_68._M_allocated_capacity._0_4_;
      aStack_68._M_allocated_capacity = (size_type)pcVar4;
    }
    EVar3 = EXTENDEE;
    goto LAB_00bfed4f;
  }
LAB_00bfe4ae:
  pOVar6 = FieldDescriptor::containing_oneof(field_local);
  if ((pOVar6 != (OneofDescriptor *)0x0) && ((field_local->field_0x1 & 0xc0) != 0x40)) {
    pcVar19 = (field_local->all_names_).payload_;
    element_name._M_len = (ulong)*(ushort *)(pcVar19 + 2);
    element_name._M_str = pcVar19 + ~element_name._M_len;
    AddError(this,element_name,&proto->super_Message,NAME,
             "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
  }
  if ((*(uint *)&proto->field_0 & 4) == 0) {
    if ((*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field_local->type_ * 4) | 2) == 10) {
      pcVar19 = (field_local->all_names_).payload_;
      uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
      pcVar19 = pcVar19 + ~uVar22;
      pcVar23 = "Field with message or enum type missing type_name.";
LAB_00bfe533:
      EVar3 = TYPE;
LAB_00bfe535:
      element_name_00._M_str = pcVar19;
      element_name_00._M_len = uVar22;
      AddError(this,element_name_00,&proto->super_Message,EVar3,pcVar23);
    }
LAB_00bfe542:
    bVar5 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field_local);
    if (bVar5) {
      if ((field_local->field_0x1 & 8) == 0) {
        return;
      }
      bVar5 = DescriptorPool::Tables::AddExtension(this->tables_,field_local);
      if (bVar5) {
        return;
      }
      local_120._0_8_ = &make_error;
      make_error.field = &field_local;
      make_error.this = this;
      pcVar19 = (field_local->all_names_).payload_;
      element_name_01._M_len = (ulong)*(ushort *)(pcVar19 + 2);
      element_name_01._M_str = pcVar19 + ~element_name_01._M_len;
      local_120._8_8_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__10,std::__cxx11::string>
      ;
      make_error_00.invoker_._0_4_ = 0xc0bda6;
      make_error_00.ptr_.obj = (void *)local_120._0_8_;
      make_error_00.invoker_._4_4_ = 0;
      AddWarning(this,element_name_01,&proto->super_Message,NUMBER,make_error_00);
      return;
    }
    FileDescriptorTables::FindFieldByNumber
              (this->file_tables_,field_local->containing_type_,field_local->number_);
    this_00 = field_local->containing_type_;
    if (this_00 == (Descriptor *)0x0) {
      local_130[1] = (FieldDescriptor *)0xddbf55;
      b = (AlphaNum *)&DAT_00000007;
    }
    else {
      local_130[1] = (FieldDescriptor *)(this_00->all_names_).payload_;
      b = (AlphaNum *)(ulong)*(ushort *)((long)local_130[1] + 2);
      local_130[1] = (FieldDescriptor *)((long)local_130[1] + ~(ulong)b);
    }
    local_130[0] = (FieldDescriptor *)b;
    if ((field_local->field_0x1 & 8) == 0) {
      fields_used.
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
      .tree_.root_ = (node_type *)
                     absl::lts_20250127::container_internal::
                     btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                     ::EmptyNode()::empty_node;
      fields_used.
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
      .tree_.rightmost_.
      super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<long,_long>_>,_std::pair<long,_long>_>::checked_compare,_std::allocator<std::pair<long,_long>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
      .
      super_Storage<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_*,_2UL,_false>
      .value = (CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::key_compare_adapter<std::less<std::pair<long,_long>_>,_std::pair<long,_long>_>::checked_compare,_std::allocator<std::pair<long,_long>_>,_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_*>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL>,_true>
                )absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::set_params<std::pair<long,long>,std::less<std::pair<long,long>>,std::allocator<std::pair<long,long>>,256,false>>
                 ::EmptyNode()::empty_node;
      fields_used.
      super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
      .
      super_btree_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
      .tree_.size_ = 0;
      for (iVar21 = 0; iVar21 < this_00->field_count_; iVar21 = iVar21 + 1) {
        pFVar9 = Descriptor::field(this_00,iVar21);
        extendee.ptr_ = (SymbolBase *)(long)pFVar9->number_;
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
        ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>,_bool>
                  *)&make_error,
                 &fields_used.
                  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                 ,(value_type *)&extendee);
      }
      for (iVar21 = 0; iVar21 < this_00->extension_range_count_; iVar21 = iVar21 + 1) {
        pEVar10 = Descriptor::extension_range(this_00,iVar21);
        b = (AlphaNum *)(long)pEVar10->start_;
        extendee.ptr_ = (SymbolBase *)b;
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
        ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>,_bool>
                  *)&make_error,
                 &fields_used.
                  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                 ,(value_type *)&extendee);
      }
      for (iVar21 = 0; iVar21 < this_00->reserved_range_count_; iVar21 = iVar21 + 1) {
        pRVar11 = Descriptor::reserved_range(this_00,iVar21);
        b = (AlphaNum *)((long)pRVar11->end + -1);
        extendee.ptr_ = (SymbolBase *)(long)pRVar11->start;
        absl::lts_20250127::container_internal::
        btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
        ::insert((pair<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>,_bool>
                  *)&make_error,
                 &fields_used.
                  super_btree_set_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>_>
                 ,(value_type *)&extendee);
      }
      iVar27 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                        *)&fields_used);
      make_error._0_12_ = iVar27._0_12_;
      iVar27 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
               ::end((btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                      *)&fields_used);
      extendee.ptr_ = (SymbolBase *)iVar27.node_;
      x = 1;
      while (((bVar5 = absl::lts_20250127::container_internal::
                       btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                       ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                                     *)&make_error,(iterator *)&extendee), bVar5 &&
              (ppVar12 = absl::lts_20250127::container_internal::
                         btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                         ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                                      *)&make_error), ppVar12->first <= x)) &&
             (lVar1 = ppVar12->second, x <= lVar1))) {
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
        ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>,_const_std::pair<long,_long>_&,_const_std::pair<long,_long>_*>
                     *)&make_error);
        x = lVar1 + 1;
      }
      if (x < 0x20000000) {
        make_error = (anon_class_16_2_f7c7e1e7)
                     absl::lts_20250127::NullSafeStringView("Next available field number is ");
        absl::lts_20250127::AlphaNum::AlphaNum((AlphaNum *)&extendee,x);
        absl::lts_20250127::StrCat_abi_cxx11_
                  (&proposed_message,(lts_20250127 *)&make_error,(AlphaNum *)&extendee,b);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&proposed_message,"There are no available field numbers",&local_1b9);
      }
      pcVar19 = (field_local->all_names_).payload_;
      element_name_04._M_len = (ulong)*(ushort *)(pcVar19 + 2);
      element_name_04._M_str = pcVar19 + ~element_name_04._M_len;
      make_error.field = local_130;
      make_error.this = (DescriptorBuilder *)&field_local;
      pcStack_108 = absl::lts_20250127::functional_internal::
                    InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__9,std::__cxx11::string>
      ;
      make_error_02.invoker_._0_4_ = 0xc0bd0b;
      make_error_02.ptr_.obj = (FileDescriptor *)&make_error;
      make_error_02.invoker_._4_4_ = 0;
      local_110 = (FileDescriptor *)&make_error;
      AddError(this,element_name_04,&proto->super_Message,NUMBER,make_error_02);
      std::__cxx11::string::~string((string *)&proposed_message);
      absl::lts_20250127::container_internal::
      btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
      ::~btree((btree<absl::lts_20250127::container_internal::set_params<std::pair<long,_long>,_std::less<std::pair<long,_long>_>,_std::allocator<std::pair<long,_long>_>,_256,_false>_>
                *)&fields_used);
      return;
    }
    pcVar19 = (field_local->all_names_).payload_;
    uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
    pcVar19 = pcVar19 + ~uVar22;
    local_100 = (pointer)&make_error;
    make_error.field = local_130;
    make_error.this = (DescriptorBuilder *)&field_local;
    pcStack_f8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__8,std::__cxx11::string>
    ;
    uVar26 = 0xc0bc8f;
    EVar3 = NUMBER;
  }
  else {
    placeholder_type = *(uint *)&proto->field_0 >> 3 & PLACEHOLDER_ENUM;
    if ((proto->field_0)._impl_.type_ == 0xe) {
      placeholder_type = PLACEHOLDER_ENUM;
    }
    if (this->pool_->enforce_weak_ == false) {
      pFVar18 = (proto->field_0)._impl_.options_;
      if (pFVar18 == (FieldOptions *)0x0) {
        pFVar18 = (FieldOptions *)&_FieldOptions_default_instance_;
      }
      bVar20 = (pFVar18->field_0)._impl_.weak_;
    }
    else {
      bVar20 = 0;
    }
    bVar24 = (bVar20 ^ 1) & this->pool_->lazily_build_dependencies_;
    puVar7 = (undefined8 *)
             ((ulong)(proto->field_0)._impl_.type_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pcVar19 = (field_local->all_names_).payload_;
    relative_to_00._M_len = (ulong)*(ushort *)(pcVar19 + 2);
    relative_to_00._M_str = pcVar19 + ~relative_to_00._M_len;
    name_00._M_str = (char *)*puVar7;
    name_00._M_len = puVar7[1];
    extendee = LookupSymbol(this,name_00,relative_to_00,placeholder_type,LOOKUP_TYPES,
                            (bool)(bVar24 ^ 1));
    if ((extendee.ptr_)->symbol_type_ == '\0') {
      if (bVar24 != 0) {
        if ((field_local->type_ < 0xf) && ((0x4c00U >> (field_local->type_ & 0x1f) & 1) != 0)) {
          puVar25 = (undefined8 *)
                    ((ulong)(proto->field_0)._impl_.type_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                    );
          poVar8 = (once_flag *)
                   DescriptorPool::Tables::AllocateBytes
                             (this->tables_,
                              *(int *)(puVar25 + 1) +
                              *(int *)(((ulong)(proto->field_0)._impl_.default_value_.tagged_ptr_.
                                               ptr_ & 0xfffffffffffffffc) + 8) + 6);
          (poVar8->control_).super___atomic_base<unsigned_int>._M_i = 0;
          field_local->type_once_ = poVar8;
          memcpy(poVar8 + 1,(void *)*puVar25,puVar25[1] + 1);
          puVar7 = (undefined8 *)
                   ((ulong)(proto->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                   0xfffffffffffffffc);
          memcpy((void *)((long)&poVar8[1].control_.super___atomic_base<unsigned_int>._M_i +
                         puVar25[1] + 1),(void *)*puVar7,puVar7[1] + 1);
          FileDescriptorTables::AddFieldByNumber(this->file_tables_,field_local);
          if ((field_local->field_0x1 & 8) == 0) {
            return;
          }
          DescriptorPool::Tables::AddExtension(this->tables_,field_local);
          return;
        }
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&make_error,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                   ,0x1eb7,
                   "field->type_ == FieldDescriptor::TYPE_MESSAGE || field->type_ == FieldDescriptor::TYPE_GROUP || field->type_ == FieldDescriptor::TYPE_ENUM"
                  );
        absl::lts_20250127::log_internal::LogMessage::
        operator<<<google::protobuf::FieldDescriptorProto,_0>((LogMessage *)&make_error,proto);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&make_error);
      }
      if ((bVar20 == 0) ||
         (name_01._M_str = "google.protobuf.Empty", name_01._M_len = 0x15,
         extendee = FindSymbol(this,name_01,true), (extendee.ptr_)->symbol_type_ == '\0')) {
        pcVar19 = (field_local->all_names_).payload_;
        uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
        pcVar19 = pcVar19 + ~uVar22;
        psVar13 = (size_t *)
                  ((ulong)(proto->field_0)._impl_.type_name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
        _Stack_98._M_p = (pointer)*psVar13;
        local_a0 = (FileDescriptor *)psVar13[1];
        uVar26 = SUB84(local_a0,0);
        uVar28 = (undefined4)((ulong)local_a0 >> 0x20);
        uVar29 = SUB84(_Stack_98._M_p,0);
        uVar30 = (undefined4)((ulong)_Stack_98._M_p >> 0x20);
        EVar3 = TYPE;
LAB_00bfec13:
        undefined_symbol._M_len._4_4_ = uVar28;
        undefined_symbol._M_len._0_4_ = uVar26;
        undefined_symbol._M_str._0_4_ = uVar29;
        undefined_symbol._M_str._4_4_ = uVar30;
        element_name_03._M_str = pcVar19;
        element_name_03._M_len = uVar22;
        AddNotDefinedError(this,element_name_03,&proto->super_Message,EVar3,undefined_symbol);
        return;
      }
    }
    bVar5 = Symbol::IsVisibleFrom(&extendee,this->file_);
    if (bVar5) {
      if ((undefined1  [80])((undefined1  [80])proto->field_0 & (undefined1  [80])0x400) ==
          (undefined1  [80])0x0) {
        if ((extendee.ptr_)->symbol_type_ == '\x04') {
          field_local->type_ = '\x0e';
          uStackY_1e0 = 0xe;
        }
        else {
          if ((extendee.ptr_)->symbol_type_ != '\x01') {
            pcVar19 = (field_local->all_names_).payload_;
            uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
            pcVar19 = pcVar19 + ~uVar22;
            local_c0 = &make_error;
            make_error.this = (DescriptorBuilder *)proto;
            pcStack_b8 = absl::lts_20250127::functional_internal::
                         InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__4,std::__cxx11::string>
            ;
            pcVar4 = pcStack_b8;
            pcStack_b8._0_4_ = 0xc0ba4a;
            uVar26 = pcStack_b8._0_4_;
            pcStack_b8 = pcVar4;
            goto LAB_00bfe8a1;
          }
          field_local->type_ = '\v';
          uStackY_1e0 = 0xb;
        }
      }
      else {
        uStackY_1e0 = (ulong)field_local->type_;
      }
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + uStackY_1e0 * 4) == 8) {
        SVar15.ptr_ = &((Descriptor *)0x0)->super_SymbolBase;
        if ((extendee.ptr_)->symbol_type_ == '\x04') {
          SVar15 = extendee;
        }
        (field_local->type_descriptor_).message_type = (Descriptor *)SVar15.ptr_;
        if ((Descriptor *)SVar15.ptr_ != (Descriptor *)0x0) {
          pEVar14 = FieldDescriptor::enum_type(field_local);
          if ((pEVar14->field_0x1 & 1) != 0) {
            field_local->field_0x1 = field_local->field_0x1 & 0xfe;
          }
          if ((field_local->field_0x1 & 1) == 0) {
            pEVar14 = FieldDescriptor::enum_type(field_local);
            if (0 < pEVar14->value_count_) {
              pEVar14 = FieldDescriptor::enum_type(field_local);
              pEVar17 = EnumDescriptor::value(pEVar14,0);
              (field_local->field_20).default_value_enum_ = pEVar17;
            }
            goto LAB_00bfe542;
          }
          bVar5 = io::Tokenizer::IsIdentifier
                            ((string *)
                             ((ulong)(proto->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                             0xfffffffffffffffc));
          if (!bVar5) {
            pcVar19 = (field_local->all_names_).payload_;
            uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
            pcVar19 = pcVar19 + ~uVar22;
            pcVar23 = "Default value for an enum field must be an identifier.";
            goto LAB_00bff006;
          }
          puVar7 = (undefined8 *)
                   ((ulong)(proto->field_0)._impl_.default_value_.tagged_ptr_.ptr_ &
                   0xfffffffffffffffc);
          pcVar19 = (char *)*puVar7;
          sVar2 = puVar7[1];
          pEVar14 = FieldDescriptor::enum_type(field_local);
          pcVar23 = (pEVar14->all_names_).payload_;
          relative_to_01._M_len = (ulong)*(ushort *)(pcVar23 + 2);
          relative_to_01._M_str = pcVar23 + ~relative_to_01._M_len;
          name_02._M_str = pcVar19;
          name_02._M_len = sVar2;
          SVar15 = LookupSymbolNoPlaceholder(this,name_02,relative_to_01,LOOKUP_ALL,true);
          if ((SVar15.ptr_)->symbol_type_ == '\x05') {
LAB_00bfee71:
            pEVar14 = ((EnumValueDescriptor *)SVar15.ptr_)->type_;
            pEVar16 = FieldDescriptor::enum_type(field_local);
            if (pEVar14 == pEVar16) {
              (field_local->field_20).default_value_enum_ = (EnumValueDescriptor *)SVar15.ptr_;
              goto LAB_00bfe542;
            }
          }
          else if ((SVar15.ptr_)->symbol_type_ == '\x06') {
            SVar15.ptr_ = SVar15.ptr_ + -1;
            goto LAB_00bfee71;
          }
          pcVar19 = (field_local->all_names_).payload_;
          element_name_06._M_len = (ulong)*(ushort *)(pcVar19 + 2);
          element_name_06._M_str = pcVar19 + ~element_name_06._M_len;
          local_f0._0_8_ = &make_error;
          make_error.field = (FieldDescriptor **)proto;
          make_error.this = (DescriptorBuilder *)&field_local;
          local_f0._8_8_ =
               absl::lts_20250127::functional_internal::
               InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__7,std::__cxx11::string>
          ;
          make_error_04.invoker_._0_4_ = 0xc0bbbe;
          make_error_04.ptr_.obj = (void *)local_f0._0_8_;
          make_error_04.invoker_._4_4_ = 0;
          AddError(this,element_name_06,&proto->super_Message,DEFAULT_VALUE,make_error_04);
          goto LAB_00bfe542;
        }
        pcVar19 = (field_local->all_names_).payload_;
        uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
        pcVar19 = pcVar19 + ~uVar22;
        local_e0._0_8_ = &make_error;
        make_error.this = (DescriptorBuilder *)proto;
        local_e0._8_8_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__6,std::__cxx11::string>
        ;
        pcVar4 = (code *)local_e0._8_8_;
        local_e0._8_4_ = 0xc0bb42;
        uVar26 = local_e0._8_4_;
        local_e0._8_8_ = pcVar4;
      }
      else {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + uStackY_1e0 * 4) != 10) {
          pcVar19 = (field_local->all_names_).payload_;
          uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
          pcVar19 = pcVar19 + ~uVar22;
          pcVar23 = "Field with primitive type has type_name.";
          goto LAB_00bfe533;
        }
        SVar15.ptr_ = &((Descriptor *)0x0)->super_SymbolBase;
        if ((extendee.ptr_)->symbol_type_ == '\x01') {
          SVar15 = extendee;
        }
        (field_local->type_descriptor_).message_type = (Descriptor *)SVar15.ptr_;
        if ((Descriptor *)SVar15.ptr_ != (Descriptor *)0x0) {
          if ((field_local->field_0x1 & 1) == 0) goto LAB_00bfe542;
          pcVar19 = (field_local->all_names_).payload_;
          uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
          pcVar19 = pcVar19 + ~uVar22;
          pcVar23 = "Messages can\'t have default values.";
LAB_00bff006:
          EVar3 = DEFAULT_VALUE;
          goto LAB_00bfe535;
        }
        pcVar19 = (field_local->all_names_).payload_;
        uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
        pcVar19 = pcVar19 + ~uVar22;
        local_d0._0_8_ = &make_error;
        make_error.this = (DescriptorBuilder *)proto;
        local_d0._8_8_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__5,std::__cxx11::string>
        ;
        pcVar4 = (code *)local_d0._8_8_;
        local_d0._8_4_ = 0xc0bac6;
        uVar26 = local_d0._8_4_;
        local_d0._8_8_ = pcVar4;
      }
    }
    else {
      pcVar19 = (field_local->all_names_).payload_;
      uVar22 = (ulong)*(ushort *)(pcVar19 + 2);
      pcVar19 = pcVar19 + ~uVar22;
      local_b0._0_8_ = &make_error;
      make_error.field = (FieldDescriptor **)this;
      make_error.this = (DescriptorBuilder *)&extendee;
      local_b0._8_8_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CrossLinkField(google::protobuf::FieldDescriptor*,google::protobuf::FieldDescriptorProto_const&)::__3,std::__cxx11::string>
      ;
      uVar26 = 0xc0ba22;
    }
LAB_00bfe8a1:
    EVar3 = TYPE;
  }
LAB_00bfed4f:
  make_error_03.invoker_._0_4_ = uVar26;
  make_error_03.ptr_.obj = &make_error;
  make_error_03.invoker_._4_4_ = 0;
  element_name_05._M_str = pcVar19;
  element_name_05._M_len = uVar22;
  AddError(this,element_name_05,&proto->super_Message,EVar3,make_error_03);
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(FieldDescriptor* field,
                                       const FieldDescriptorProto& proto) {
  if (proto.has_extendee() && field->is_extension()) {
    Symbol extendee =
        LookupSymbol(proto.extendee(), field->full_name(),
                     DescriptorPool::PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type() != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return absl::StrCat("\"", proto.extendee(),
                                     "\" is not a message type.");
               });
      return;
    } else if (!extendee.IsVisibleFrom(file_)) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return extendee.GetVisibilityError(file_, "target of extend");
               });
      return;
    }

    field->containing_type_ = extendee.descriptor();

    const Descriptor::ExtensionRange* extension_range =
        field->containing_type()->FindExtensionRangeContainingNumber(
            field->number());

    if (extension_range == nullptr) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "\"$0\" does not declare $1 as an "
                     "extension number.",
                     field->containing_type()->full_name(), field->number());
               });
    }
  }

  if (field->containing_oneof() != nullptr) {
    if (field->label_ != FieldDescriptor::LABEL_OPTIONAL) {
      // Note that this error will never happen when parsing .proto files.
      // It can only happen if you manually construct a FileDescriptorProto
      // that is incorrect.
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    // In case of weak fields we force building the dependency. We need to know
    // if the type exist or not. If it doesn't exist we substitute Empty which
    // should only be done if the type can't be found in the generated pool.
    // TODO Ideally we should query the database directly to check
    // if weak fields exist or not so that we don't need to force building
    // weak dependencies. However the name lookup rules for symbols are
    // somewhat complicated, so I defer it too another CL.
    bool is_weak = !pool_->enforce_weak_ && proto.options().weak();
    bool is_lazy = pool_->lazily_build_dependencies_ && !is_weak;

    Symbol type =
        LookupSymbol(proto.type_name(), field->full_name(),
                     expecting_enum ? DescriptorPool::PLACEHOLDER_ENUM
                                    : DescriptorPool::PLACEHOLDER_MESSAGE,
                     LOOKUP_TYPES, !is_lazy);

    if (type.IsNull()) {
      if (is_lazy) {
        ABSL_CHECK(field->type_ == FieldDescriptor::TYPE_MESSAGE ||
                   field->type_ == FieldDescriptor::TYPE_GROUP ||
                   field->type_ == FieldDescriptor::TYPE_ENUM)
            << proto;
        // Save the symbol names for later for lookup, and allocate the once
        // object needed for the accessors.
        const std::string& name = proto.type_name();

        int name_sizes = static_cast<int>(name.size() + 1 +
                                          proto.default_value().size() + 1);

        field->type_once_ = ::new (tables_->AllocateBytes(
            static_cast<int>(sizeof(absl::once_flag)) + name_sizes))
            absl::once_flag{};
        char* names = reinterpret_cast<char*>(field->type_once_ + 1);

        memcpy(names, name.c_str(), name.size() + 1);
        memcpy(names + name.size() + 1, proto.default_value().c_str(),
               proto.default_value().size() + 1);

        // AddFieldByNumber and AddExtension are done later in this function,
        // and can/must be done if the field type was not found. The related
        // error checking is not necessary when in lazily_build_dependencies_
        // mode, and can't be done without building the type's descriptor,
        // which we don't want to do.
        file_tables_->AddFieldByNumber(field);
        if (field->is_extension()) {
          tables_->AddExtension(field);
        }
        return;
      } else {
        // If the type is a weak type, we change the type to a google.protobuf.Empty
        // field.
        if (is_weak) {
          type = FindSymbol(kNonLinkedWeakMessageReplacementName);
        }
        if (type.IsNull()) {
          AddNotDefinedError(field->full_name(), proto,
                             DescriptorPool::ErrorCollector::TYPE,
                             proto.type_name());
          return;
        }
      }
    }

    if (!type.IsVisibleFrom(file_)) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               [&] { return type.GetVisibilityError(file_); });
      return;
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type() == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type() == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::StrCat("\"", proto.type_name(),
                                       "\" is not a type.");
                 });
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      field->type_descriptor_.message_type = type.descriptor();
      if (field->type_descriptor_.message_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::StrCat("\"", proto.type_name(),
                                       "\" is not a message type.");
                 });
        return;
      }

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      field->type_descriptor_.enum_type = type.enum_descriptor();
      if (field->type_descriptor_.enum_type == nullptr) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE, [&] {
                   return absl::StrCat("\"", proto.type_name(),
                                       "\" is not an enum type.");
                 });
        return;
      }

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // Ensure that the default value is an identifier. Parser cannot always
        // verify this because it does not have complete type information.
        // N.B. that this check yields better error messages but is not
        // necessary for correctness (an enum symbol must be a valid identifier
        // anyway), only for better errors.
        if (!io::Tokenizer::IsIdentifier(proto.default_value())) {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Default value for an enum field must be an identifier.");
        } else {
          // We can't just use field->enum_type()->FindValueByName() here
          // because that locks the pool's mutex, which we have already locked
          // at this point.
          const EnumValueDescriptor* default_value =
              LookupSymbolNoPlaceholder(proto.default_value(),
                                        field->enum_type()->full_name())
                  .enum_value_descriptor();

          if (default_value != nullptr &&
              default_value->type() == field->enum_type()) {
            field->default_value_enum_ = default_value;
          } else {
            AddError(field->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE, [&] {
                       return absl::StrCat("Enum type \"",
                                           field->enum_type()->full_name(),
                                           "\" has no value named \"",
                                           proto.default_value(), "\".");
                     });
          }
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  // know their containing type until now. If we're in
  // lazily_build_dependencies_ mode, we're guaranteed there's no errors, so no
  // risk to calling containing_type() or other accessors that will build
  // dependencies.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field = file_tables_->FindFieldByNumber(
        field->containing_type(), field->number());
    const absl::string_view containing_type_name =
        field->containing_type() == nullptr
            ? absl::string_view("unknown")
            : field->containing_type()->full_name();
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "Extension number $0 has already been used "
                     "in \"$1\" by extension \"$2\".",
                     field->number(), containing_type_name,
                     conflicting_field->full_name());
               });
    } else {
      absl::btree_set<std::pair<int64_t, int64_t>> fields_used;
      auto* parent = field->containing_type();
      for (int i = 0; i < parent->field_count(); ++i) {
        int n = parent->field(i)->number();
        fields_used.insert({n, n});
      }
      for (int i = 0; i < parent->extension_range_count(); ++i) {
        auto* range = parent->extension_range(i);
        fields_used.insert({range->start_number(),
                            static_cast<int64_t>(range->end_number()) - 1});
      }
      for (int i = 0; i < parent->reserved_range_count(); ++i) {
        auto* range = parent->reserved_range(i);
        fields_used.insert(
            {range->start, static_cast<int64_t>(range->end) - 1});
      }
      int64_t proposed_number = 1;
      for (auto [start, end] : fields_used) {
        if (start <= proposed_number && proposed_number <= end) {
          proposed_number = end + 1;
        } else {
          break;
        }
      }

      const std::string proposed_message =
          proposed_number <= FieldDescriptor::kMaxNumber
              ? absl::StrCat("Next available field number is ", proposed_number)
              : "There are no available field numbers";

      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER, [&] {
                 return absl::Substitute(
                     "Field number $0 has already been used in "
                     "\"$1\" by field \"$2\". $3.",
                     field->number(), containing_type_name,
                     conflicting_field->name(), proposed_message);
               });
    }
  } else {
    if (field->is_extension()) {
      if (!tables_->AddExtension(field)) {
        auto make_error = [&] {
          const FieldDescriptor* conflicting_field =
              tables_->FindExtension(field->containing_type(), field->number());
          const absl::string_view containing_type_name =
              field->containing_type() == nullptr
                  ? absl::string_view("unknown")
                  : field->containing_type()->full_name();
          return absl::Substitute(
              "Extension number $0 has already been used in \"$1\" by "
              "extension "
              "\"$2\" defined in $3.",
              field->number(), containing_type_name,
              conflicting_field->full_name(),
              conflicting_field->file()->name());
        };
        // Conflicting extension numbers should be an error. However, before
        // turning this into an error we need to fix all existing broken
        // protos first.
        // TODO: Change this to an error.
        AddWarning(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER, make_error);
      }

    }
  }
}